

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

char * zt_cstr_basename(char *npath,size_t len,char *path,char *suffix)

{
  ssize_t sVar1;
  ssize_t j;
  
  memset(npath,0,len);
  j = -1;
  sVar1 = zt_cstr_rfind(path,0,-1,"/");
  if (suffix != (char *)0x0) {
    j = zt_cstr_rfind(path,sVar1 + 1,-1,suffix);
    if (0 < j) {
      j = j - (ulong)(path[j] == '.');
    }
  }
  zt_cstr_copy(path,sVar1 + 1,j,npath,len);
  return npath;
}

Assistant:

char*
zt_cstr_basename(char *npath, size_t len, const char *path, const char *suffix) {
    ssize_t   start;
    ssize_t   end;

    zt_assert(npath);
    zt_assert(path);

    memset(npath, '\0', len);

    if ((start = zt_cstr_rfind(path, 0, -1, PATH_SEPERATOR)) != -1) {
        start = start + strlen(PATH_SEPERATOR);
    } else {
        start = 0;
    }

    if (suffix) {
        end = zt_cstr_rfind(path, start, -1, suffix);
        if (end > 0 && path[end] == '.') {
            end--;
        }
    } else {
        end = -1;
    }

    zt_cstr_copy(path, start, end, npath, len);
    return npath;
}